

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::AnnotatedEnumHandler::~AnnotatedEnumHandler(AnnotatedEnumHandler *this)

{
  kj::
  Table<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>_>
  ::~Table(&(this->nameToValue).table);
  kj::Array<kj::StringPtr>::~Array(&this->valueToName);
  return;
}

Assistant:

class JsonCodec::AnnotatedEnumHandler final: public JsonCodec::Handler<DynamicEnum> {
public:
  AnnotatedEnumHandler(EnumSchema schema): schema(schema) {
    auto enumerants = schema.getEnumerants();
    auto builder = kj::heapArrayBuilder<kj::StringPtr>(enumerants.size());

    for (auto e: enumerants) {
      auto proto = e.getProto();
      kj::StringPtr name = proto.getName();

      for (auto anno: proto.getAnnotations()) {
        switch (anno.getId()) {
          case JSON_NAME_ANNOTATION_ID:
            name = anno.getValue().getText();
            break;
        }
      }

      builder.add(name);
      nameToValue.insert(name, e.getIndex());
    }

    valueToName = builder.finish();
  }

  void encode(const JsonCodec& codec, DynamicEnum input, JsonValue::Builder output) const override {
    KJ_IF_SOME(e, input.getEnumerant()) {
      KJ_ASSERT(e.getIndex() < valueToName.size());
      output.setString(valueToName[e.getIndex()]);
    } else {
      output.setNumber(input.getRaw());
    }
  }

  DynamicEnum decode(const JsonCodec& codec, JsonValue::Reader input) const override {
    if (input.isNumber()) {
      return DynamicEnum(schema, static_cast<uint16_t>(input.getNumber()));
    } else {
      uint16_t val = KJ_REQUIRE_NONNULL(nameToValue.find(input.getString()),
          "invalid enum value", input.getString());
      return DynamicEnum(schema.getEnumerants()[val]);
    }
  }